

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall GlobOptBlockData::KillSymToValueMapForGeneratorYield(GlobOptBlockData *this)

{
  ValueInfo *this_00;
  Sym *pSVar1;
  JitArenaAllocator *this_01;
  code *pcVar2;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  ulong uVar6;
  GlobHashTable *pGVar7;
  undefined1 local_48 [8];
  EditingIterator iter;
  
  pGVar7 = this->symToValueMap;
  if (pGVar7->tableSize != 0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar6 = 0;
    do {
      local_48 = (undefined1  [8])(pGVar7->table + uVar6);
      iter.super_Iterator.list =
           (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_48;
      while( true ) {
        if (iter.super_Iterator.list ==
            (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
        iter.super_Iterator.list =
             (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
             ((iter.super_Iterator.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])iter.super_Iterator.list == local_48) break;
        pTVar5 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                 ::Data((Iterator *)local_48);
        if (pTVar5->element != (Value *)0x0) {
          this_00 = pTVar5->element->valueInfo;
          pSVar1 = this_00->symStore;
          if (((((pSVar1 == (Sym *)0x0) || (pSVar1->m_kind != SymKindStack)) ||
               (((ulong)pSVar1[1]._vptr_Sym & 0x2000) == 0)) &&
              ((pSVar1 = pTVar5->value, pSVar1 != (Sym *)0x0 && (pSVar1->m_kind == SymKindStack))))
             && (((ulong)pSVar1[1]._vptr_Sym & 0x2000) != 0)) {
            ValueInfo::SetSymStore(this_00,pSVar1);
          }
        }
      }
      uVar6 = uVar6 + 1;
      pGVar7 = this->symToValueMap;
    } while (uVar6 < pGVar7->tableSize);
    if (pGVar7->tableSize != 0) {
      uVar6 = 0;
      do {
        local_48 = (undefined1  [8])(pGVar7->table + uVar6);
        iter.super_Iterator.current = (NodeBase *)0x0;
        iter.super_Iterator.list =
             (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_48;
        while (bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                       EditingIterator::Next((EditingIterator *)local_48), bVar3) {
          pTVar5 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_48);
          buffer = iter.super_Iterator.list;
          if ((((pTVar5->element == (Value *)0x0) ||
               (pSVar1 = pTVar5->element->valueInfo->symStore, pSVar1 == (Sym *)0x0)) ||
              (pSVar1->m_kind != SymKindStack)) || (((ulong)pSVar1[1]._vptr_Sym & 0x2000) == 0)) {
            this_01 = this->symToValueMap->alloc;
            SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::UnlinkCurrentNode((EditingIterator *)local_48);
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                      ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_01
                       ,buffer,0x18);
          }
        }
        uVar6 = uVar6 + 1;
        pGVar7 = this->symToValueMap;
      } while (uVar6 < pGVar7->tableSize);
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::KillSymToValueMapForGeneratorYield()
{
    // Remove illegal symToValueMap entries whose symstores don't have bytecode registers
    // Hash table bucket key-value visualization: { bucket.value: bucket.element }
    //
    // Idea:
    // Multiple symbols can map to the same value which has a symstore
    // (multiple keys map to same value).
    // Since the symstore might not have a bytecode register, our first pass
    // through the map attemps to use the symbol (key) as a symstore for that value.
    // This allows us to still retain such entries.
    // After the first pass, any symToValueMap entries whose symstores don't have
    // bytecode registers will be cleared.
    FOREACH_VALUEHASHTABLE_ENTRY(GlobHashBucket, bucket, this->symToValueMap)
    {
        if (bucket.element == nullptr)
        {
            continue;
        }

        Sym* symStore = bucket.element->GetValueInfo()->GetSymStore();
        if (symStore != nullptr && symStore->IsStackSym() && symStore->AsStackSym()->HasByteCodeRegSlot())
        {
            continue;
        }

        Sym* sym = bucket.value;
        if (sym != nullptr && sym->IsStackSym() && sym->AsStackSym()->HasByteCodeRegSlot())
        {
            bucket.element->GetValueInfo()->SetSymStore(sym);
        }
    }
    NEXT_VALUEHASHTABLE_ENTRY;

    // Remove illegal entries
    FOREACH_VALUEHASHTABLE_ENTRY_EDITING(GlobHashBucket, bucket, this->symToValueMap, iter)
    {
        Value* value = bucket.element;
        if (value == nullptr)
        {
            iter.RemoveCurrent(this->symToValueMap->alloc);
        }
        else
        {
            Sym* symStore = value->GetValueInfo()->GetSymStore();
            if (symStore == nullptr || !symStore->IsStackSym() || !symStore->AsStackSym()->HasByteCodeRegSlot())
            {
                iter.RemoveCurrent(this->symToValueMap->alloc);
            }
        }
    }
    NEXT_VALUEHASHTABLE_ENTRY_EDITING;
}